

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O3

msecnode_t * P_AddSecnode(sector_t *s,AActor *thing,msecnode_t *nextnode,msecnode_t **sec_thinglist)

{
  msecnode_t **ppmVar1;
  msecnode_t *pmVar2;
  int iVar3;
  undefined4 extraout_var;
  msecnode_t *pmVar5;
  PClass *pPVar4;
  
  if (s == (sector_t *)0x0) {
    pPVar4 = (thing->super_DThinker).super_DObject.Class;
    if (pPVar4 == (PClass *)0x0) {
      iVar3 = (**(thing->super_DThinker).super_DObject._vptr_DObject)(thing);
      pPVar4 = (PClass *)CONCAT44(extraout_var,iVar3);
      (thing->super_DThinker).super_DObject.Class = pPVar4;
    }
    I_FatalError("AddSecnode of 0 for %s\n",
                 FName::NameData.NameArray[(pPVar4->super_PStruct).super_PNamedType.TypeName.Index].
                 Text);
  }
  pmVar5 = nextnode;
  if (nextnode != (msecnode_t *)0x0) {
    do {
      if (pmVar5->m_sector == s) {
        pmVar5->m_thing = thing;
        return nextnode;
      }
      ppmVar1 = &pmVar5->m_tnext;
      pmVar5 = *ppmVar1;
    } while (*ppmVar1 != (msecnode_t *)0x0);
  }
  if (headsecnode == (msecnode_t *)0x0) {
    pmVar5 = (msecnode_t *)
             M_Malloc_Dbg(0x38,
                          "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_map.cpp"
                          ,0x1838);
  }
  else {
    pmVar5 = headsecnode;
    headsecnode = headsecnode->m_snext;
  }
  pmVar5->visited = false;
  pmVar5->m_sector = s;
  pmVar5->m_thing = thing;
  pmVar5->m_tprev = (msecnode_t *)0x0;
  pmVar5->m_tnext = nextnode;
  if (nextnode != (msecnode_t *)0x0) {
    nextnode->m_tprev = pmVar5;
  }
  pmVar5->m_sprev = (msecnode_t *)0x0;
  pmVar2 = *sec_thinglist;
  pmVar5->m_snext = pmVar2;
  if (pmVar2 != (msecnode_t *)0x0) {
    pmVar2->m_sprev = pmVar5;
  }
  *sec_thinglist = pmVar5;
  return pmVar5;
}

Assistant:

msecnode_t *P_AddSecnode(sector_t *s, AActor *thing, msecnode_t *nextnode, msecnode_t *&sec_thinglist)
{
	msecnode_t *node;

	if (s == 0)
	{
		I_FatalError("AddSecnode of 0 for %s\n", thing->GetClass()->TypeName.GetChars());
	}

	node = nextnode;
	while (node)
	{
		if (node->m_sector == s)	// Already have a node for this sector?
		{
			node->m_thing = thing;	// Yes. Setting m_thing says 'keep it'.
			return nextnode;
		}
		node = node->m_tnext;
	}

	// Couldn't find an existing node for this sector. Add one at the head
	// of the list.

	node = P_GetSecnode();

	// killough 4/4/98, 4/7/98: mark new nodes unvisited.
	node->visited = 0;

	node->m_sector = s; 			// sector
	node->m_thing = thing; 		// mobj
	node->m_tprev = NULL;			// prev node on Thing thread
	node->m_tnext = nextnode;		// next node on Thing thread
	if (nextnode)
		nextnode->m_tprev = node;	// set back link on Thing

	// Add new node at head of sector thread starting at s->touching_thinglist

	node->m_sprev = NULL;			// prev node on sector thread
	node->m_snext = sec_thinglist; // next node on sector thread
	if (sec_thinglist)
		node->m_snext->m_sprev = node;
	sec_thinglist = node;
	return node;
}